

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

string * google::protobuf::compiler::anon_unknown_0::MapEntryName
                   (string *__return_storage_ptr__,string *field_name)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  reference pcVar4;
  char cVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char field_name_char;
  const_iterator __end3;
  const_iterator __begin3;
  string *__range3;
  bool cap_next;
  string *field_name_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  bVar2 = true;
  __end3._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while (bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffb8), bVar3) {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end3);
    cVar1 = *pcVar4;
    if (cVar1 == '_') {
      bVar2 = true;
    }
    else {
      cVar5 = (char)__return_storage_ptr__;
      if (bVar2) {
        if ((cVar1 < 'a') || ('z' < cVar1)) {
          std::__cxx11::string::push_back(cVar5);
        }
        else {
          std::__cxx11::string::push_back(cVar5);
        }
        bVar2 = false;
      }
      else {
        std::__cxx11::string::push_back(cVar5);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end3);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string MapEntryName(const std::string& field_name) {
  std::string result;
  static const char kSuffix[] = "Entry";
  result.reserve(field_name.size() + sizeof(kSuffix));
  bool cap_next = true;
  for (const char field_name_char : field_name) {
    if (field_name_char == '_') {
      cap_next = true;
    } else if (cap_next) {
      // Note: Do not use ctype.h due to locales.
      if ('a' <= field_name_char && field_name_char <= 'z') {
        result.push_back(field_name_char - 'a' + 'A');
      } else {
        result.push_back(field_name_char);
      }
      cap_next = false;
    } else {
      result.push_back(field_name_char);
    }
  }
  result.append(kSuffix);
  return result;
}